

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

SyntaxList<slang::syntax::PropertyCaseItemSyntax> *
slang::syntax::deepClone<slang::syntax::PropertyCaseItemSyntax>
          (SyntaxList<slang::syntax::PropertyCaseItemSyntax> *node,BumpAllocator *alloc)

{
  pointer ppPVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  SyntaxList<slang::syntax::PropertyCaseItemSyntax> *pSVar4;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  long lVar5;
  span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL> *args;
  SmallVector<slang::syntax::PropertyCaseItemSyntax_*,_5UL> buffer;
  span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL> local_80;
  SmallVector<slang::syntax::PropertyCaseItemSyntax_*,_5UL> local_70;
  
  SmallVector<slang::syntax::PropertyCaseItemSyntax_*,_5UL>::SmallVector
            (&local_70,
             (node->super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>).
             _M_extent._M_extent_value);
  ppPVar1 = (node->super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>).
            _M_ptr;
  sVar2 = (node->super_span<slang::syntax::PropertyCaseItemSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  src = extraout_RDX;
  for (lVar5 = 0; sVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
    local_80._M_ptr = (pointer)deepClone(*(SyntaxNode **)((long)ppPVar1 + lVar5),alloc);
    SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*>::
    emplace_back<slang::syntax::PropertyCaseItemSyntax*>
              ((SmallVectorBase<slang::syntax::PropertyCaseItemSyntax*> *)&local_70,
               (PropertyCaseItemSyntax **)&local_80);
    src = extraout_RDX_00;
  }
  iVar3 = SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::copy
                    (&local_70.super_SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>,
                     (EVP_PKEY_CTX *)alloc,src);
  local_80._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
  args = &local_80;
  pSVar4 = BumpAllocator::
           emplace<slang::syntax::SyntaxList<slang::syntax::PropertyCaseItemSyntax>,std::span<slang::syntax::PropertyCaseItemSyntax*,18446744073709551615ul>>
                     (alloc,args);
  SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>::cleanup
            (&local_70.super_SmallVectorBase<slang::syntax::PropertyCaseItemSyntax_*>,
             (EVP_PKEY_CTX *)args);
  return pSVar4;
}

Assistant:

SyntaxList<T>* deepClone(const SyntaxList<T>& node, BumpAllocator& alloc) {
    SmallVector<T*> buffer(node.size(), UninitializedTag());
    for (auto& t : node)
        buffer.push_back(deepClone(*t, alloc));

    return alloc.emplace<SyntaxList<T>>(buffer.copy(alloc));
}